

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O1

Model * gvr::loadPLY(char *name)

{
  pointer pcVar1;
  _Rb_tree_node_base *p_Var2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  ply_type pVar7;
  ply_type pVar8;
  int iVar9;
  TexturedMesh *this;
  ulong uVar10;
  ImageIO *this_00;
  _Rb_tree_node_base *p_Var11;
  long lVar12;
  int __oflag;
  TexturedMesh *pTVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  string s;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  list;
  PLYReader ply;
  string local_590;
  undefined1 local_570 [32];
  _Rb_tree_node_base *local_550;
  size_t local_548;
  long local_540;
  long local_538;
  string local_530;
  string local_510;
  string local_4f0;
  undefined1 *local_4d0 [2];
  undefined1 local_4c0 [16];
  undefined1 *local_4b0 [2];
  undefined1 local_4a0 [16];
  string local_490;
  string local_470;
  string local_450;
  string local_430;
  string local_410;
  string local_3f0;
  string local_3d0;
  string local_3b0;
  string local_390;
  string local_370;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  undefined1 *local_2d0 [2];
  undefined1 local_2c0 [16];
  undefined1 *local_2b0 [2];
  undefined1 local_2a0 [16];
  string local_290;
  PLYReader local_270;
  
  local_270.filename._M_dataplus._M_p = (pointer)&local_270.filename.field_2;
  local_270.filename._M_string_length = 0;
  local_270.filename.field_2._M_local_buf[0] = '\0';
  std::ifstream::ifstream(&local_270.in);
  local_270.list.super__Vector_base<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_270.list.super__Vector_base<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_270.list.super__Vector_base<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  PLYReader::open(&local_270,name,__oflag);
  pcVar1 = local_570 + 0x10;
  local_570._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_570,"vertex","");
  local_538 = PLYReader::instancesOfElement(&local_270,(string *)local_570);
  if ((pointer)local_570._0_8_ != pcVar1) {
    operator_delete((void *)local_570._0_8_);
  }
  local_570._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_570,"face","");
  local_540 = PLYReader::instancesOfElement(&local_270,(string *)local_570);
  if ((pointer)local_570._0_8_ != pcVar1) {
    operator_delete((void *)local_570._0_8_);
  }
  local_570._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_570,"vertex","");
  local_590._M_dataplus._M_p = (pointer)&local_590.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_590,"diffuse_red","");
  pVar7 = PLYReader::getTypeOfProperty(&local_270,(string *)local_570,&local_590);
  bVar6 = true;
  if (pVar7 == ply_none) {
    local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"vertex","");
    local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_310,"red","");
    pVar8 = PLYReader::getTypeOfProperty(&local_270,&local_2f0,&local_310);
    if (pVar8 != ply_none) goto LAB_00122336;
    local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_330,"vertex","");
    local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_350,"r","");
    pVar8 = PLYReader::getTypeOfProperty(&local_270,&local_330,&local_350);
    bVar6 = pVar8 != ply_none;
    bVar16 = true;
  }
  else {
LAB_00122336:
    bVar16 = false;
  }
  if (bVar16) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_350._M_dataplus._M_p != &local_350.field_2) {
      operator_delete(local_350._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_330._M_dataplus._M_p != &local_330.field_2) {
      operator_delete(local_330._M_dataplus._M_p);
    }
  }
  if (pVar7 == ply_none) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_310._M_dataplus._M_p != &local_310.field_2) {
      operator_delete(local_310._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
      operator_delete(local_2f0._M_dataplus._M_p);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_590._M_dataplus._M_p != &local_590.field_2) {
    operator_delete(local_590._M_dataplus._M_p);
  }
  if ((pointer)local_570._0_8_ != pcVar1) {
    operator_delete((void *)local_570._0_8_);
  }
  local_570._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_570,"vertex","");
  local_590._M_dataplus._M_p = (pointer)&local_590.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_590,"u","");
  pVar7 = PLYReader::getTypeOfProperty(&local_270,(string *)local_570,&local_590);
  bVar16 = pVar7 != ply_none;
  if (pVar7 == ply_none) {
LAB_00122498:
    local_4f0._M_dataplus._M_p = (pointer)&local_4f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_4f0,"vertex","");
    local_510._M_dataplus._M_p = (pointer)&local_510.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_510,"texture_u","");
    pVar7 = PLYReader::getTypeOfProperty(&local_270,&local_4f0,&local_510);
    bVar14 = pVar7 != ply_none;
    if (bVar14) {
      local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b0,"vertex","");
      local_3d0._M_dataplus._M_p = (pointer)&local_3d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d0,"texture_v","");
      pVar7 = PLYReader::getTypeOfProperty(&local_270,&local_3b0,&local_3d0);
      if (pVar7 != ply_none) {
        bVar3 = true;
        bVar14 = true;
        goto LAB_00122586;
      }
    }
    local_530._M_dataplus._M_p = (pointer)&local_530.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_530,"vertex","");
    local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f0,"s","");
    pVar7 = PLYReader::getTypeOfProperty(&local_270,&local_530,&local_3f0);
    if (pVar7 == ply_none) {
      bVar3 = true;
      bVar4 = false;
      bVar5 = true;
      bVar15 = false;
    }
    else {
      local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_410,"vertex","");
      local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_430,"t","");
      pVar7 = PLYReader::getTypeOfProperty(&local_270,&local_410,&local_430);
      bVar15 = pVar7 != ply_none;
      bVar3 = true;
      bVar5 = true;
      bVar4 = true;
    }
  }
  else {
    local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_370,"vertex","");
    local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_390,"v","");
    pVar7 = PLYReader::getTypeOfProperty(&local_270,&local_370,&local_390);
    if (pVar7 == ply_none) goto LAB_00122498;
    bVar16 = true;
    bVar3 = false;
    bVar14 = false;
LAB_00122586:
    bVar5 = false;
    bVar4 = false;
    bVar15 = true;
  }
  if (bVar4) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_430._M_dataplus._M_p != &local_430.field_2) {
      operator_delete(local_430._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_410._M_dataplus._M_p != &local_410.field_2) {
      operator_delete(local_410._M_dataplus._M_p);
    }
  }
  if (bVar5) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
      operator_delete(local_3f0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_530._M_dataplus._M_p != &local_530.field_2) {
      operator_delete(local_530._M_dataplus._M_p);
    }
  }
  if (bVar14) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
      operator_delete(local_3d0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
      operator_delete(local_3b0._M_dataplus._M_p);
    }
  }
  if (bVar3) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_510._M_dataplus._M_p != &local_510.field_2) {
      operator_delete(local_510._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4f0._M_dataplus._M_p != &local_4f0.field_2) {
      operator_delete(local_4f0._M_dataplus._M_p);
    }
  }
  if (bVar16) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_390._M_dataplus._M_p != &local_390.field_2) {
      operator_delete(local_390._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_370._M_dataplus._M_p != &local_370.field_2) {
      operator_delete(local_370._M_dataplus._M_p);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_590._M_dataplus._M_p != &local_590.field_2) {
    operator_delete(local_590._M_dataplus._M_p);
  }
  if ((pointer)local_570._0_8_ != pcVar1) {
    operator_delete((void *)local_570._0_8_);
  }
  local_570._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_570,"face","");
  local_590._M_dataplus._M_p = (pointer)&local_590.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_590,"texcoord","");
  pVar7 = PLYReader::getTypeOfProperty(&local_270,(string *)local_570,&local_590);
  if (pVar7 == ply_none) {
    bVar16 = false;
  }
  else {
    local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_450,"face","");
    local_470._M_dataplus._M_p = (pointer)&local_470.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_470,"texnumber","");
    pVar7 = PLYReader::getTypeOfProperty(&local_270,&local_450,&local_470);
    bVar16 = pVar7 != ply_none;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_470._M_dataplus._M_p != &local_470.field_2) {
      operator_delete(local_470._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_450._M_dataplus._M_p != &local_450.field_2) {
      operator_delete(local_450._M_dataplus._M_p);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_590._M_dataplus._M_p != &local_590.field_2) {
    operator_delete(local_590._M_dataplus._M_p);
  }
  if ((pointer)local_570._0_8_ != pcVar1) {
    operator_delete((void *)local_570._0_8_);
  }
  if ((int)local_538 < 1) {
    this = (TexturedMesh *)0x0;
    pTVar13 = (TexturedMesh *)0x0;
    goto LAB_00122a07;
  }
  if ((int)local_540 < 1) {
    if (bVar6) {
      this = (TexturedMesh *)operator_new(0xb0);
      ColoredPointCloud::ColoredPointCloud((ColoredPointCloud *)this);
    }
    else {
      this = (TexturedMesh *)operator_new(0xa8);
      PointCloud::PointCloud((PointCloud *)this);
    }
LAB_001229f3:
    pTVar13 = (TexturedMesh *)0x0;
  }
  else {
    if (bVar16) {
      this = (TexturedMesh *)operator_new(0x100);
      MultiTexturedMesh::MultiTexturedMesh((MultiTexturedMesh *)this);
      goto LAB_001229f3;
    }
    if (!bVar15) {
      if (bVar6) {
        this = (TexturedMesh *)operator_new(200);
        ColoredMesh::ColoredMesh((ColoredMesh *)this);
      }
      else {
        this = (TexturedMesh *)operator_new(0xc0);
        Mesh::Mesh((Mesh *)this);
      }
      goto LAB_001229f3;
    }
    this = (TexturedMesh *)operator_new(0x108);
    TexturedMesh::TexturedMesh(this);
    pTVar13 = this;
  }
  (*(this->super_Mesh).super_PointCloud.super_Model._vptr_Model[6])(this,&local_270);
LAB_00122a07:
  if ((pTVar13 != (TexturedMesh *)0x0) && ((pTVar13->name)._M_string_length == 0)) {
    std::__cxx11::string::string((string *)&local_590,name,(allocator *)local_570);
    uVar10 = std::__cxx11::string::rfind((char)&local_590,0x2e);
    if (uVar10 < local_590._M_string_length) {
      p_Var2 = (_Rb_tree_node_base *)(local_570 + 8);
      local_570._8_4_ = _S_red;
      local_570._16_8_ = 0;
      local_548 = 0;
      local_570._24_8_ = p_Var2;
      local_550 = p_Var2;
      std::__cxx11::string::substr((ulong)&local_290,(ulong)&local_590);
      local_490._M_dataplus._M_p = (pointer)&local_490.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_490,"");
      gutil::getFileList((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_570,&local_290,&local_490);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_490._M_dataplus._M_p != &local_490.field_2) {
        operator_delete(local_490._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290._M_dataplus._M_p != &local_290.field_2) {
        operator_delete(local_290._M_dataplus._M_p);
      }
      if ((_Rb_tree_node_base *)local_570._24_8_ != p_Var2) {
        p_Var11 = (_Rb_tree_node_base *)local_570._24_8_;
        do {
          iVar9 = std::__cxx11::string::compare((string *)&local_590);
          if (iVar9 != 0) {
            this_00 = gimage::getImageIO();
            bVar6 = gimage::ImageIO::handlesFile(this_00,*(char **)(p_Var11 + 1),true);
            if (bVar6) {
              std::__cxx11::string::_M_assign((string *)&local_590);
              lVar12 = std::__cxx11::string::rfind((char)&local_590,0x2f);
              if (lVar12 == -1) {
                lVar12 = std::__cxx11::string::rfind((char)&local_590,0x5c);
              }
              if (lVar12 == -1) {
                local_4b0[0] = local_4a0;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_4b0,"");
                std::__cxx11::string::_M_assign((string *)&pTVar13->basepath);
                if (local_4b0[0] != local_4a0) {
                  operator_delete(local_4b0[0]);
                }
                local_4d0[0] = local_4c0;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_4d0,local_590._M_dataplus._M_p,
                           local_590._M_dataplus._M_p + local_590._M_string_length);
                std::__cxx11::string::_M_assign((string *)&pTVar13->name);
                local_2d0[0] = local_4d0[0];
                if (local_4d0[0] == local_4c0) break;
              }
              else {
                std::__cxx11::string::substr((ulong)local_2b0,(ulong)&local_590);
                std::__cxx11::string::_M_assign((string *)&pTVar13->basepath);
                if (local_2b0[0] != local_2a0) {
                  operator_delete(local_2b0[0]);
                }
                std::__cxx11::string::substr((ulong)local_2d0,(ulong)&local_590);
                std::__cxx11::string::_M_assign((string *)&pTVar13->name);
                if (local_2d0[0] == local_2c0) break;
              }
              operator_delete(local_2d0[0]);
              break;
            }
          }
          p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11);
        } while (p_Var11 != p_Var2);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_570);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_590._M_dataplus._M_p != &local_590.field_2) {
      operator_delete(local_590._M_dataplus._M_p);
    }
  }
  PLYReader::~PLYReader(&local_270);
  return (Model *)this;
}

Assistant:

Model *loadPLY(const char *name)
{
  PLYReader ply;

  ply.open(name);

  // determine data type

  int vn=static_cast<int>(ply.instancesOfElement("vertex"));
  int tn=static_cast<int>(ply.instancesOfElement("face"));

  bool pervertexcolor=ply.getTypeOfProperty("vertex", "diffuse_red") != ply_none ||
                      ply.getTypeOfProperty("vertex", "red") != ply_none ||
                      ply.getTypeOfProperty("vertex", "r") != ply_none;

  bool texture=(ply.getTypeOfProperty("vertex", "u") != ply_none &&
                ply.getTypeOfProperty("vertex", "v") != ply_none) ||
               (ply.getTypeOfProperty("vertex", "texture_u") != ply_none &&
                ply.getTypeOfProperty("vertex", "texture_v") != ply_none) ||
               (ply.getTypeOfProperty("vertex", "s") != ply_none &&
                ply.getTypeOfProperty("vertex", "t") != ply_none);

  bool multitexture=ply.getTypeOfProperty("face", "texcoord") != ply_none &&
                    ply.getTypeOfProperty("face", "texnumber") != ply_none;

  // create best data type

  Model *model=0;
  TexturedMesh *tm=0;

  if (vn > 0)
  {
    if (tn > 0)
    {
      if (multitexture)
      {
        model=new MultiTexturedMesh();
      }
      else if (texture)
      {
        model=tm=new TexturedMesh();
      }
      else if (pervertexcolor)
      {
        model=new ColoredMesh();
      }
      else
      {
        model=new Mesh();
      }
    }
    else
    {
      if (pervertexcolor)
      {
        model=new ColoredPointCloud();
      }
      else
      {
        model=new PointCloud();
      }
    }

    // load from PLY into the allocated data set

    model->loadPLY(ply);
  }

  // optionally try to guess the name of the texture from the file name

  if (tm != 0 && tm->getTextureName().size() == 0)
  {
    std::string s=name;
    size_t i=s.rfind('.');

    if (i < s.size())
    {
      std::set<std::string> list;
      gutil::getFileList(list, s.substr(0, i+1), "");

      for (std::set<std::string>::iterator it=list.begin(); it!=list.end(); ++it)
      {
        if (s.compare(*it) != 0  && gimage::getImageIO().handlesFile(it->c_str(), true))
        {
          s=*it;

          i=s.rfind('/');

          if (i == s.npos)
          {
            i=s.rfind('\\');
          }

          if (i != s.npos)
          {
            tm->setBasePath(s.substr(0, i+1));
            tm->setTextureName(s.substr(i+1));
          }
          else
          {
            tm->setBasePath("");
            tm->setTextureName(s);
          }

          break;
        }
      }
    }
  }

  return model;
}